

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O2

void __thiscall
FIX::SocketAcceptor::onConfigure(SocketAcceptor *this,SessionSettings *sessionSettings)

{
  bool bVar1;
  Dictionary *this_00;
  _Base_ptr p_Var2;
  allocator<char> local_81;
  string local_80;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_60;
  
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &local_60,sessionSettings);
  for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    this_00 = SessionSettings::get(sessionSettings,(SessionID *)(p_Var2 + 1));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"SocketAcceptPort",&local_81);
    Dictionary::getInt(this_00,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"SocketReuseAddress",&local_81);
    bVar1 = Dictionary::has(this_00,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"SocketReuseAddress",&local_81);
      Dictionary::getBool(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"SocketNodelay",&local_81);
    bVar1 = Dictionary::has(this_00,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"SocketNodelay",&local_81);
      Dictionary::getBool(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

EXCEPT(ConfigError) {
  for (const SessionID &sessionID : sessionSettings.getSessions()) {
    const Dictionary &settings = sessionSettings.get(sessionID);
    settings.getInt(SOCKET_ACCEPT_PORT);
    if (settings.has(SOCKET_REUSE_ADDRESS)) {
      settings.getBool(SOCKET_REUSE_ADDRESS);
    }
    if (settings.has(SOCKET_NODELAY)) {
      settings.getBool(SOCKET_NODELAY);
    }
  }
}